

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::PipelineResourceSignatureVkImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureVkImpl *this,DeviceContextVkImpl *pDeviceCtx,
          SPIRVShaderResourceAttribs *SPIRVAttribs,Uint32 ResIndex,
          ShaderResourceCacheVk *ResourceCache,char *ShaderName,char *PSOName)

{
  Uint32 *Args_8;
  BufferViewDesc *Args;
  BufferDesc *Args_2;
  PipelineResourceDesc *pPVar1;
  ShaderResourceCacheVk *pSVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Resource *pRVar8;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar9;
  DescriptorSet *this_00;
  Resource *pRVar10;
  TextureViewVkImpl *pViewImpl;
  BufferViewVkImpl *pBVar11;
  BufferVkImpl *pBVar12;
  RenderDeviceVkImpl *pRVar13;
  uint uVar14;
  undefined4 in_register_0000000c;
  char *Args_1;
  ulong uVar15;
  Uint32 ArrIndex;
  RefCntAutoPtr<Diligent::IDeviceObject> *this_01;
  Uint64 *Args_00;
  PipelineResourceAttribsType *pPVar16;
  ulong uVar17;
  char (*in_stack_ffffffffffffff28) [108];
  string msg;
  String local_88;
  PipelineResourceAttribsType *local_68;
  ShaderResourceCacheVk *local_60;
  DeviceContextVkImpl *local_58;
  char *ShaderName_local;
  long local_48;
  ulong local_40;
  DescriptorSet *local_38;
  
  local_60 = ResourceCache;
  local_58 = pDeviceCtx;
  ShaderName_local = ShaderName;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",
               (char (*) [31])CONCAT44(in_register_0000000c,ResIndex));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x329);
    std::__cxx11::string::~string((string *)&msg);
  }
  pPVar1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           .m_Desc.Resources;
  pPVar16 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            m_pResourceAttribs + ResIndex;
  iVar5 = strcmp(pPVar1[ResIndex].Name,SPIRVAttribs->Name);
  if (iVar5 != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Inconsistent resource names");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x32c);
    std::__cxx11::string::~string((string *)&msg);
  }
  pSVar2 = local_60;
  bVar4 = true;
  if (pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_SAMPLER || -1 < (long)*(ulong *)pPVar16)
  {
    local_38 = ShaderResourceCacheVk::GetDescriptorSet
                         (local_60,(uint)(*(ulong *)pPVar16 >> 0x3e) & 1);
    uVar17 = (ulong)(~*(uint *)&pSVar2->field_0x1c >> 0x1f);
    local_40 = (ulong)(&pPVar16->SRBCacheOffset)[uVar17];
    uVar14 = *(uint *)&pPVar16->field_0x4 & 0x1ffffff;
    Args_1 = (char *)(ulong)uVar14;
    if (uVar14 < SPIRVAttribs->ArraySize) {
      FormatString<char[26],char[47]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SPIRVAttribs.ArraySize <= ResAttribs.ArraySize",
                 (char (*) [47])Args_1);
      Args_1 = (char *)0x335;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                 ,0x335);
      std::__cxx11::string::~string((string *)&msg);
    }
    local_48 = uVar17 * 4 + 8;
    Args_8 = &SPIRVAttribs->BufferStaticSize;
    bVar4 = true;
    uVar14 = 0;
    local_68 = pPVar16;
    while( true ) {
      if (SPIRVAttribs->ArraySize <= uVar14) break;
      pRVar8 = ShaderResourceCacheVk::DescriptorSet::GetResource(local_38,(int)local_40 + uVar14);
      pPVar16 = local_68;
      if ((pRVar8->pObject).m_pObject == (IDeviceObject *)0x0) {
        GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                  (&local_88,SPIRVAttribs,uVar14);
        Args_1 = "\'";
        FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                  (&msg,(Diligent *)"No resource is bound to variable \'",(char (*) [35])&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' in shader \'",(char (*) [14])&ShaderName_local,(char **)"\' of PSO \'",
                   (char (*) [11])&PSOName,(char **)0x6cec4a,(char (*) [2])in_stack_ffffffffffffff28
                  );
        std::__cxx11::string::~string((string *)&local_88);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_1 = (char *)0x0;
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
        bVar4 = false;
      }
      else {
        if ((~(uint)*(ulong *)local_68 & 0xffff0000) != 0) {
          ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                              (&this->
                                super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                               (uint)*(ulong *)local_68 >> 0x10);
          pPVar9 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                             (&this->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              (uint)*(ushort *)&pPVar16->field_0x2);
          if (ResDesc->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
            FormatString<char[26],char[60]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                       (char (*) [60])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x347);
            std::__cxx11::string::~string((string *)&msg);
            pPVar16 = local_68;
          }
          uVar7 = ResDesc->ArraySize;
          uVar6 = 1;
          if ((uVar7 != 1) && (uVar6 = uVar7, uVar7 != pPVar1[ResIndex].ArraySize)) {
            FormatString<char[26],char[79]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize"
                       ,(char (*) [79])(ulong)uVar7);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x348);
            std::__cxx11::string::~string((string *)&msg);
            uVar6 = ResDesc->ArraySize;
            pPVar16 = local_68;
          }
          if ((-1 < *(long *)pPVar9) && (uVar14 < uVar6)) {
            this_00 = ShaderResourceCacheVk::GetDescriptorSet
                                (local_60,(uint)((ulong)*(long *)pPVar9 >> 0x3e));
            pRVar10 = ShaderResourceCacheVk::DescriptorSet::GetResource
                                (this_00,*(int *)(&pPVar9->field_0x0 + local_48) + uVar14);
            if ((pRVar10->pObject).m_pObject == (IDeviceObject *)0x0) {
              GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&local_88,ResDesc,uVar14);
              FormatString<char[42],std::__cxx11::string,char[26],char_const*,char[14],char_const*,char[11],char_const*,char[3]>
                        (&msg,(Diligent *)"No sampler is bound to sampler variable \'",
                         (char (*) [42])&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\' combined with texture \'",(char (*) [26])SPIRVAttribs,
                         (char **)"\' in shader \'",(char (*) [14])&ShaderName_local,
                         (char **)"\' of PSO \'",(char (*) [11])&PSOName,(char **)"\'.",
                         (char (*) [3])in_stack_ffffffffffffff28);
              std::__cxx11::string::~string((string *)&local_88);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
              }
              std::__cxx11::string::~string((string *)&msg);
              bVar4 = false;
            }
          }
        }
        Args_1 = (char *)(*(ulong *)pPVar16 >> 0x39 & 0xffffff1f);
        if ((byte)Args_1 < 0xd) {
          this_01 = &pRVar8->pObject;
          uVar7 = (uint)(*(ulong *)pPVar16 >> 0x39) & 0x1f;
          Args_1 = (char *)0x1e00;
          if ((0x1e00U >> uVar7 & 1) == 0) {
            Args_1 = (char *)0xe;
            if ((0xeU >> uVar7 & 1) == 0) {
              Args_1 = (char *)0x180;
              if ((0x180U >> uVar7 & 1) != 0) {
                if (pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
                  FormatString<char[26],char[61]>
                            (&msg,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])
                             "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER",
                             (char (*) [61])0x180);
                  Args_1 = (char *)0x35e;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                             ,0x35e);
                  std::__cxx11::string::~string((string *)&msg);
                }
                pBVar12 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferVkImpl>
                                    (this_01);
                if (((pBVar12 != (BufferVkImpl *)0x0) &&
                    (DeviceContextVkImpl::DvpVerifyDynamicAllocation(local_58,pBVar12),
                    (pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_Desc.Size < (ulong)*Args_8)) &&
                   (pRVar13 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                              ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                           *)this),
                   ((pRVar13->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                   VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                  GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                            (&local_88,SPIRVAttribs,uVar14);
                  Args_1 = "\' bound to shader variable \'";
                  FormatString<char[29],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                            (&msg,(Diligent *)"The size of uniform buffer \'",
                             (char (*) [29])
                             &(pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                              .m_Desc,(char **)"\' bound to shader variable \'",
                             (char (*) [29])&local_88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "\' is ",(char (*) [6])
                                      &(pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                                       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                       .m_Desc.Size,
                             (unsigned_long *)" bytes, but the shader expects at least ",
                             (char (*) [41])Args_8,(uint *)0x7e9695,
                             (char (*) [8])in_stack_ffffffffffffff28);
                  std::__cxx11::string::~string((string *)&local_88);
                  if (DebugMessageCallback != (undefined *)0x0) {
                    Args_1 = (char *)0x0;
                    (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
                  }
                  goto LAB_00208e69;
                }
              }
            }
            else {
              if ((pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV) &&
                 (pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_UAV)) {
                FormatString<char[26],char[117]>
                          (&msg,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])
                           "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV"
                           ,(char (*) [117])0xe);
                Args_1 = (char *)0x39e;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                           ,0x39e);
                std::__cxx11::string::~string((string *)&msg);
              }
              pViewImpl = RefCntAutoPtr<Diligent::IDeviceObject>::
                          RawPtr<Diligent::TextureViewVkImpl>(this_01);
              if (pViewImpl != (TextureViewVkImpl *)0x0) {
                bVar3 = ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
                                  (SPIRVAttribs->Name,(uint)SPIRVAttribs->ArraySize,uVar14,pViewImpl
                                   ,SPIRVAttribs->field_0xb & 0x7f,
                                   (bool)((byte)SPIRVAttribs->field_0xb >> 7));
                bVar4 = (bool)(bVar3 & bVar4);
                Args_1 = (char *)pViewImpl;
              }
            }
          }
          else {
            if ((pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV) &&
               (pPVar1[ResIndex].ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
              FormatString<char[26],char[115]>
                        (&msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])
                         "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV"
                         ,(char (*) [115])0x1e00);
              Args_1 = (char *)0x376;
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                         ,0x376);
              std::__cxx11::string::~string((string *)&msg);
            }
            pBVar11 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferViewVkImpl>
                                (this_01);
            if (pBVar11 != (BufferViewVkImpl *)0x0) {
              pBVar12 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>
                                  ((pBVar11->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                                   m_pBuffer);
              Args = &(pBVar11->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                      .m_Desc;
              Args_2 = &(pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        .m_Desc;
              DeviceContextVkImpl::DvpVerifyDynamicAllocation(local_58,pBVar12);
              Args_1 = (char *)(ulong)(pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                                      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                      .m_Desc.ElementByteStride;
              Args_00 = &(pBVar11->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                         .m_Desc.ByteWidth;
              uVar17 = (pBVar11->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                       .m_Desc.ByteWidth;
              uVar15 = (ulong)*Args_8;
              if ((TextureViewVkImpl *)Args_1 == (TextureViewVkImpl *)0x0) {
                if ((uVar17 < uVar15) &&
                   (pRVar13 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                              ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                           *)this),
                   ((pRVar13->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                   VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                  GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                            (&local_88,SPIRVAttribs,uVar14);
                  Args_1 = "\' of buffer \'";
                  FormatString<char[26],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                            (&msg,(Diligent *)"The size of buffer view \'",(char (*) [26])Args,
                             (char **)"\' of buffer \'",(char (*) [14])Args_2,
                             (char **)"\' bound to shader variable \'",(char (*) [29])&local_88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "\' is ",(char (*) [6])Args_00,
                             (unsigned_long *)" bytes, but the shader expects at least ",
                             (char (*) [41])Args_8,(uint *)0x7e9695,
                             (char (*) [8])in_stack_ffffffffffffff28);
                  std::__cxx11::string::~string((string *)&local_88);
                  if (DebugMessageCallback != (undefined *)0x0) {
                    Args_1 = (char *)0x0;
                    (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
                  }
                  std::__cxx11::string::~string((string *)&msg);
                }
              }
              else if (((uVar17 < uVar15) || ((uVar17 - uVar15) % (ulong)Args_1 != 0)) &&
                      (pRVar13 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                              *)this),
                      ((pRVar13->
                       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_ValidationFlags &
                      VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != VALIDATION_FLAG_NONE)) {
                GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                          (&local_88,SPIRVAttribs,uVar14);
                Args_1 = ") and stride (";
                FormatString<char[11],unsigned_long,char[15],unsigned_int,char[19],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[108]>
                          (&msg,(Diligent *)"The size (",(char (*) [11])Args_00,
                           (unsigned_long *)") and stride (",
                           (char (*) [15])
                           &(pBVar12->super_BufferBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            .m_Desc.ElementByteStride,(uint *)") of buffer view \'",
                           (char (*) [19])Args,(char **)"\' of buffer \'",(char (*) [14])Args_2,
                           (char **)"\' bound to shader variable \'",(char (*) [29])&local_88,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' are incompatible with what the shader expects. This may be the result of the array element size mismatch."
                           ,in_stack_ffffffffffffff28);
                std::__cxx11::string::~string((string *)&local_88);
                if (DebugMessageCallback != (undefined *)0x0) {
                  Args_1 = (char *)0x0;
                  (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
                }
LAB_00208e69:
                std::__cxx11::string::~string((string *)&msg);
              }
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool PipelineResourceSignatureVkImpl::DvpValidateCommittedResource(const DeviceContextVkImpl*        pDeviceCtx,
                                                                   const SPIRVShaderResourceAttribs& SPIRVAttribs,
                                                                   Uint32                            ResIndex,
                                                                   const ShaderResourceCacheVk&      ResourceCache,
                                                                   const char*                       ShaderName,
                                                                   const char*                       PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc    = m_Desc.Resources[ResIndex];
    const auto& ResAttribs = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, SPIRVAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && ResAttribs.IsImmutableSamplerAssigned())
        return true; // Skip immutable separate samplers

    const auto& DescrSetResources = ResourceCache.GetDescriptorSet(ResAttribs.DescrSet);
    const auto  CacheType         = ResourceCache.GetContentType();
    const auto  CacheOffset       = ResAttribs.CacheOffset(CacheType);

    VERIFY_EXPR(SPIRVAttribs.ArraySize <= ResAttribs.ArraySize);

    bool BindingsOK = true;
    for (Uint32 ArrIndex = 0; ArrIndex < SPIRVAttribs.ArraySize; ++ArrIndex)
    {
        const auto& Res = DescrSetResources.GetResource(CacheOffset + ArrIndex);
        if (Res.IsNull())
        {
            LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(SPIRVAttribs, ArrIndex),
                              "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
            BindingsOK = false;
            continue;
        }

        if (ResAttribs.IsCombinedWithSampler())
        {
            const auto& SamplerResDesc = GetResourceDesc(ResAttribs.SamplerInd);
            const auto& SamplerAttribs = GetResourceAttribs(ResAttribs.SamplerInd);
            VERIFY_EXPR(SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            VERIFY_EXPR(SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize);
            if (!SamplerAttribs.IsImmutableSamplerAssigned())
            {
                if (ArrIndex < SamplerResDesc.ArraySize)
                {
                    const auto& SamDescrSetResources = ResourceCache.GetDescriptorSet(SamplerAttribs.DescrSet);
                    const auto  SamCacheOffset       = SamplerAttribs.CacheOffset(CacheType);
                    const auto& Sam                  = SamDescrSetResources.GetResource(SamCacheOffset + ArrIndex);
                    if (Sam.IsNull())
                    {
                        LOG_ERROR_MESSAGE("No sampler is bound to sampler variable '", GetShaderResourcePrintName(SamplerResDesc, ArrIndex),
                                          "' combined with texture '", SPIRVAttribs.Name, "' in shader '", ShaderName, "' of PSO '", PSOName, "'.");
                        BindingsOK = false;
                    }
                }
            }
        }

        switch (ResAttribs.GetDescriptorType())
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pBufferVk = Res.pObject.RawPtr<BufferVkImpl>())
                {
                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if ((pBufferVk->GetDesc().Size < SPIRVAttribs.BufferStaticSize) &&
                        (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                    {
                        // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                        LOG_WARNING_MESSAGE("The size of uniform buffer '",
                                            pBufferVk->GetDesc().Name, "' bound to shader variable '",
                                            GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", pBufferVk->GetDesc().Size,
                                            " bytes, but the shader expects at least ", SPIRVAttribs.BufferStaticSize,
                                            " bytes.");
                    }
                }
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (auto* pBufferViewVk = Res.pObject.RawPtr<BufferViewVkImpl>())
                {
                    const auto* pBufferVk = ClassPtrCast<BufferVkImpl>(pBufferViewVk->GetBuffer());
                    const auto& ViewDesc  = pBufferViewVk->GetDesc();
                    const auto& BuffDesc  = pBufferVk->GetDesc();

                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if (BuffDesc.ElementByteStride == 0)
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                            LOG_WARNING_MESSAGE("The size of buffer view '", ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", ViewDesc.ByteWidth, " bytes, but the shader expects at least ",
                                                SPIRVAttribs.BufferStaticSize, " bytes.");
                        }
                    }
                    else
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize || (ViewDesc.ByteWidth - SPIRVAttribs.BufferStaticSize) % BuffDesc.ElementByteStride != 0) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // For buffers with dynamic arrays we know only static part size and array element stride.
                            // Element stride in the shader may be differ than in the code. Here we check that the buffer size is exactly the same as the array with N elements.
                            LOG_WARNING_MESSAGE("The size (", ViewDesc.ByteWidth, ") and stride (", BuffDesc.ElementByteStride, ") of buffer view '",
                                                ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' are incompatible with what the shader expects. This may be the result of the array element size mismatch.");
                        }
                    }
                }
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pTexViewVk = Res.pObject.RawPtr<TextureViewVkImpl>())
                {
                    if (!ValidateResourceViewDimension(SPIRVAttribs.Name, SPIRVAttribs.ArraySize, ArrIndex, pTexViewVk, SPIRVAttribs.GetResourceDimension(), SPIRVAttribs.IsMultisample()))
                        BindingsOK = false;
                }
                break;

            default:
                break;
                // Nothing to do
        }
    }

    return BindingsOK;
}